

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

optional<bool>
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_4<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  atomic<long> *paVar1;
  ulong uVar2;
  __int_type _Var3;
  __int_type _Var4;
  uint uVar5;
  write_guard wVar6;
  write_guard wVar7;
  bool bVar8;
  ushort uVar9;
  uint uVar10;
  int iVar11;
  pthread_t pVar12;
  basic_node_ptr<unodb::detail::olc_node_header> bVar13;
  void *extraout_RDX;
  long lVar14;
  ushort uVar15;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar16;
  optimistic_lock *poVar17;
  undefined1 auVar18 [16];
  __atomic_base<unsigned_long> local_78;
  write_guard node_guard;
  uint8_t local_68;
  write_guard local_48;
  write_guard child_guard_1;
  write_guard node_guard_1;
  write_guard child_guard;
  
  auVar18[1] = key_byte;
  auVar18[0] = key_byte;
  auVar18[2] = key_byte;
  auVar18[3] = key_byte;
  auVar18[4] = key_byte;
  auVar18[5] = key_byte;
  auVar18[6] = key_byte;
  auVar18[7] = key_byte;
  auVar18[8] = key_byte;
  auVar18[9] = key_byte;
  auVar18[10] = key_byte;
  auVar18[0xb] = key_byte;
  auVar18[0xc] = key_byte;
  auVar18[0xd] = key_byte;
  auVar18[0xe] = key_byte;
  auVar18[0xf] = key_byte;
  auVar18 = vpcmpeqb_avx(auVar18,ZEXT416((uint)(inode->
                                               super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>
                                               ).keys));
  uVar10 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) &
           ~(-1 << ((inode->super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).
                    field_0x20 & 0x1f));
  if (uVar10 == 0) {
    poVar17 = parent_critical_section->lock;
    _Var3 = (parent_critical_section->version).version;
    if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) {
LAB_0016048e:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    _Var4 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
    LOCK();
    paVar1 = &poVar17->read_lock_count;
    lVar14 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (_Var3 != _Var4) goto LAB_00160309;
    if (lVar14 < 1) goto LAB_001604ad;
    parent_critical_section->lock = (optimistic_lock *)0x0;
    poVar17 = node_critical_section->lock;
    _Var3 = (node_critical_section->version).version;
    if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0016048e;
    _Var4 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
    LOCK();
    paVar1 = &poVar17->read_lock_count;
    lVar14 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (_Var3 == _Var4) {
      if (lVar14 < 1) goto LAB_001604ad;
      node_critical_section->lock = (optimistic_lock *)0x0;
LAB_00160201:
      uVar15 = 0x100;
      uVar9 = 0;
      goto LAB_00160208;
    }
    if (lVar14 < 1) goto LAB_001604ad;
LAB_00160325:
    node_critical_section->lock = (optimistic_lock *)0x0;
  }
  else {
    uVar5 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    piVar16 = (inode->super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).children
              ._M_elems + uVar5;
    child->tagged_ptr = (piVar16->value)._M_i.tagged_ptr;
    bVar8 = optimistic_lock::check
                      (node_critical_section->lock,
                       (version_type)(node_critical_section->version).version);
    if (!bVar8) goto LAB_00160325;
    optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffff88);
    child_critical_section->lock = (optimistic_lock *)local_78._M_i;
    local_78._M_i = 0;
    (child_critical_section->version).version = (version_tag_type)node_guard.lock;
    optimistic_lock::read_critical_section::~read_critical_section
              ((read_critical_section *)&stack0xffffffffffffff88);
    if (child_critical_section->lock != (optimistic_lock *)0x0) {
      uVar2 = child->tagged_ptr;
      *child_type = (node_type)uVar2 & (I256|I48);
      if ((uVar2 & 7) == 0) {
        iVar11 = basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::cmp
                           ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)
                            (uVar2 & 0xfffffffffffffff8),(void *)k.field_0,extraout_RDX);
        if (iVar11 == 0) {
          if ((inode->super_olc_inode_4_parent<unsigned_long,_std::span<const_std::byte>_>).
              field_0x20 != '\x02') {
            poVar17 = parent_critical_section->lock;
            _Var3 = (parent_critical_section->version).version;
            if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0016048e;
            _Var4 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
            LOCK();
            paVar1 = &poVar17->read_lock_count;
            lVar14 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (_Var3 == _Var4) {
              if (lVar14 < 1) goto LAB_001604ad;
              uVar15 = 0;
              parent_critical_section->lock = (optimistic_lock *)0x0;
              bVar8 = optimistic_lock::try_upgrade_to_write_lock
                                (node_critical_section->lock,
                                 (version_type)(node_critical_section->version).version);
              local_78._M_i = 0;
              if (bVar8) {
                local_78._M_i = (__int_type)node_critical_section->lock;
              }
              node_critical_section->lock = (optimistic_lock *)0x0;
              if ((optimistic_lock *)local_78._M_i != (optimistic_lock *)0x0) {
                bVar8 = optimistic_lock::try_upgrade_to_write_lock
                                  (child_critical_section->lock,
                                   (version_type)(child_critical_section->version).version);
                uVar15 = 0;
                poVar17 = (optimistic_lock *)0x0;
                if (bVar8) {
                  poVar17 = child_critical_section->lock;
                }
                child_critical_section->lock = (optimistic_lock *)0x0;
                node_guard_1.lock = poVar17;
                if (poVar17 != (optimistic_lock *)0x0) {
                  optimistic_lock::atomic_version_type::write_unlock_and_obsolete(&poVar17->version)
                  ;
                  pVar12 = pthread_self();
                  (poVar17->obsoleter_thread)._M_thread = pVar12;
                  node_guard_1.lock = (optimistic_lock *)0x0;
                  olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
                  remove(inode,(char *)((ulong)uVar5 & 0xff));
                  *child_in_parent =
                       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)0x0;
                  uVar15 = 0x100;
                }
                optimistic_lock::write_guard::~write_guard(&node_guard_1);
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffff88);
              goto LAB_001600a3;
            }
            goto LAB_00160309;
          }
          bVar8 = optimistic_lock::try_upgrade_to_write_lock
                            (parent_critical_section->lock,
                             (version_type)(parent_critical_section->version).version);
          node_guard_1.lock = (optimistic_lock *)0x0;
          if (bVar8) {
            node_guard_1.lock = parent_critical_section->lock;
          }
          parent_critical_section->lock = (optimistic_lock *)0x0;
          if (node_guard_1.lock != (optimistic_lock *)0x0) {
            bVar8 = optimistic_lock::try_upgrade_to_write_lock
                              (node_critical_section->lock,
                               (version_type)(node_critical_section->version).version);
            child_guard_1.lock = (optimistic_lock *)0x0;
            if (bVar8) {
              child_guard_1.lock = node_critical_section->lock;
            }
            node_critical_section->lock = (optimistic_lock *)0x0;
            if (child_guard_1.lock != (optimistic_lock *)0x0) {
              bVar8 = optimistic_lock::try_upgrade_to_write_lock
                                (child_critical_section->lock,
                                 (version_type)(child_critical_section->version).version);
              wVar7.lock = child_guard_1.lock;
              local_48.lock = (optimistic_lock *)0x0;
              if (bVar8) {
                local_48.lock = child_critical_section->lock;
              }
              child_critical_section->lock = (optimistic_lock *)0x0;
              if (local_48.lock != (optimistic_lock *)0x0) {
                local_78._M_i = (__int_type)db_instance;
                node_guard.lock = (optimistic_lock *)inode;
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                          (&(child_guard_1.lock)->version);
                pVar12 = pthread_self();
                wVar6.lock = local_48.lock;
                ((wVar7.lock)->obsoleter_thread)._M_thread = pVar12;
                child_guard_1.lock = (optimistic_lock *)0x0;
                optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                          (&(local_48.lock)->version);
                ((wVar6.lock)->obsoleter_thread)._M_thread = pVar12;
                local_48.lock = (optimistic_lock *)0x0;
                local_68 = (uint8_t)uVar5;
                bVar13 = olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>
                         ::leave_last_child(inode,local_68,db_instance);
                (node_in_parent->value)._M_i.tagged_ptr = bVar13.tagged_ptr;
                if (child_guard_1.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!node_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x62e,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>]"
                               );
                }
                if (local_48.lock != (optimistic_lock *)0x0) {
                  __assert_fail("!child_guard.active()",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x62f,
                                "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = unsigned long, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>]"
                               );
                }
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                std::
                unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)&stack0xffffffffffffff88);
                optimistic_lock::write_guard::~write_guard(&local_48);
                optimistic_lock::write_guard::~write_guard(&child_guard_1);
                optimistic_lock::write_guard::~write_guard(&node_guard_1);
                LOCK();
                (db_instance->shrinking_inode_counts)._M_elems[0].super___atomic_base<unsigned_long>
                ._M_i = (db_instance->shrinking_inode_counts)._M_elems[0].
                        super___atomic_base<unsigned_long>._M_i + 1;
                UNLOCK();
                goto LAB_0016009e;
              }
              optimistic_lock::write_guard::~write_guard(&local_48);
            }
            optimistic_lock::write_guard::~write_guard(&child_guard_1);
          }
          optimistic_lock::write_guard::~write_guard(&node_guard_1);
        }
        else {
          poVar17 = parent_critical_section->lock;
          _Var3 = (parent_critical_section->version).version;
          if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0016048e;
          _Var4 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
          LOCK();
          paVar1 = &poVar17->read_lock_count;
          lVar14 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (_Var3 != _Var4) goto LAB_00160309;
          if (lVar14 < 1) goto LAB_001604ad;
          parent_critical_section->lock = (optimistic_lock *)0x0;
          poVar17 = node_critical_section->lock;
          _Var3 = (node_critical_section->version).version;
          if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0016048e;
          _Var4 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
          LOCK();
          paVar1 = &poVar17->read_lock_count;
          lVar14 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (_Var3 == _Var4) {
            if (lVar14 < 1) goto LAB_001604ad;
            node_critical_section->lock = (optimistic_lock *)0x0;
            poVar17 = child_critical_section->lock;
            _Var3 = (child_critical_section->version).version;
            if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0016048e;
            _Var4 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
            LOCK();
            paVar1 = &poVar17->read_lock_count;
            lVar14 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (_Var3 == _Var4) {
              if (lVar14 < 1) goto LAB_001604ad;
              child_critical_section->lock = (optimistic_lock *)0x0;
              goto LAB_00160201;
            }
            if (lVar14 < 1) goto LAB_001604ad;
            child_critical_section->lock = (optimistic_lock *)0x0;
          }
          else {
            if (lVar14 < 1) goto LAB_001604ad;
            node_critical_section->lock = (optimistic_lock *)0x0;
          }
        }
      }
      else {
        *child_in_parent = piVar16;
        poVar17 = parent_critical_section->lock;
        _Var3 = (parent_critical_section->version).version;
        if ((poVar17->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_0016048e;
        _Var4 = (poVar17->version).version.super___atomic_base<unsigned_long>._M_i;
        LOCK();
        paVar1 = &poVar17->read_lock_count;
        lVar14 = (paVar1->super___atomic_base<long>)._M_i;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if (_Var3 == _Var4) {
          if (lVar14 < 1) goto LAB_001604ad;
          parent_critical_section->lock = (optimistic_lock *)0x0;
LAB_0016009e:
          uVar15 = 0x100;
LAB_001600a3:
          uVar9 = 1;
          goto LAB_00160208;
        }
LAB_00160309:
        if (lVar14 < 1) {
LAB_001604ad:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
        parent_critical_section->lock = (optimistic_lock *)0x0;
      }
    }
  }
  uVar9 = 0;
  uVar15 = 0;
LAB_00160208:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar15 | uVar9);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}